

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  lu_byte lVar1;
  byte bVar2;
  Node *pNVar3;
  uint uVar4;
  undefined8 extraout_RAX;
  Value *pVVar5;
  Node *value;
  byte bVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  undefined4 in_R8D;
  undefined4 in_register_00000084;
  long lVar11;
  ulong uVar12;
  TValue key;
  Table newt;
  Value local_98;
  lu_byte local_90;
  Table local_88;
  ulong local_58;
  Node *local_50;
  ulong local_48;
  Value local_40;
  byte local_38;
  
  if (newasize < 0x80000001) {
    uVar9 = t->asize;
    uVar12 = (ulong)uVar9;
    local_88.flags = 0;
    setnodevector(L,&local_88,nhsize);
    if (newasize < uVar9) {
      lVar1 = t->lsizenode;
      local_50 = t->node;
      local_48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),t->flags) & 0xffffff40;
      t->lsizenode = local_88.lsizenode;
      t->node = local_88.node;
      t->flags = local_88.flags & 0x40 | t->flags & 0xbf;
      local_58 = CONCAT44(in_register_00000084,CONCAT31((int3)((uint)in_R8D >> 8),local_88.flags)) &
                 0xffffffffffffffbf;
      local_88.flags = (local_88.flags & 0xbf) + (char)local_48;
      iVar8 = uVar9 - newasize;
      lVar11 = ~(ulong)newasize << 3;
      lVar7 = (ulong)newasize + 4;
      local_88.lsizenode = lVar1;
      local_88.node = local_50;
      do {
        bVar2 = *(byte *)((long)t->array + lVar7);
        if ((bVar2 & 0xf) != 0) {
          local_98.gc = (GCObject *)(lVar7 + -3);
          local_90 = '\x03';
          local_40 = *(Value *)((long)t->array + lVar11);
          local_38 = bVar2;
          insertkey(t,(TValue *)&local_98,(TValue *)&local_40);
        }
        lVar11 = lVar11 + -8;
        lVar7 = lVar7 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      bVar2 = t->flags;
      local_88.lsizenode = t->lsizenode;
      local_88.node = t->node;
      t->lsizenode = lVar1;
      t->node = local_50;
      t->flags = bVar2 & 0xbf | (byte)local_48;
      local_88.flags = bVar2 & 0x40 | (byte)local_58;
    }
    pVVar5 = resizearray(L,t,uVar9,newasize);
    if ((newasize == 0) || (pVVar5 != (Value *)0x0)) {
      bVar2 = t->lsizenode;
      pNVar3 = t->node;
      bVar6 = t->flags & 0x40;
      t->lsizenode = local_88.lsizenode;
      t->node = local_88.node;
      bVar10 = local_88.flags & 0x40;
      local_88.flags = local_88.flags & 0xbf | bVar6;
      t->flags = bVar10 | t->flags & 0xbf;
      t->array = pVVar5;
      t->asize = newasize;
      if (pVVar5 != (Value *)0x0) {
        *(uint *)pVVar5 = newasize >> 1;
      }
      if (uVar9 < newasize) {
        do {
          *(undefined1 *)((long)t->array + uVar12 + 4) = 0x10;
          uVar12 = uVar12 + 1;
        } while (newasize != uVar12);
      }
      uVar9 = 1;
      local_88.lsizenode = bVar2;
      local_88.node = pNVar3;
      do {
        if ((*(byte *)((long)pNVar3 + (ulong)(uVar9 - 1) * 0x18 + 8) & 0xf) != 0) {
          value = pNVar3 + (uVar9 - 1);
          local_98 = (value->u).key_val;
          local_90 = (value->u).key_tt;
          newcheckedkey(t,(TValue *)&local_98,&value->i_val);
        }
        uVar4 = uVar9 >> (bVar2 & 0x1f);
        uVar9 = uVar9 + 1;
      } while (uVar4 == 0);
      if (bVar6 == 0) {
        luaM_free_(L,(void *)((ulong)(bVar2 < 3) * 8 + -8 + (long)pNVar3),
                   (0x18L << (bVar2 & 0x3f)) + (ulong)(bVar2 >= 3) * 8);
        return;
      }
      return;
    }
    luaH_resize_cold_1();
  }
  luaG_runerror(L,"table overflow");
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned newasize,
                                          unsigned nhsize) {
  Table newt;  /* to keep the new hash part */
  unsigned oldasize = t->asize;
  Value *newarray;
  if (newasize > MAXASIZE)
    luaG_runerror(L, "table overflow");
  /* create new hash part with appropriate size into 'newt' */
  newt.flags = 0;
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    /* re-insert into the new hash the elements from vanishing slice */
    exchangehashpart(t, &newt);  /* pretend table has new hash */
    reinsertOldSlice(t, oldasize, newasize);
    exchangehashpart(t, &newt);  /* restore old hash (in case of errors) */
  }
  /* allocate new array */
  newarray = resizearray(L, t, oldasize, newasize);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->asize = newasize;
  if (newarray != NULL)
    *lenhint(t) = newasize / 2u;  /* set an initial hint */
  clearNewSlice(t, oldasize, newasize);
  /* re-insert elements from old hash part into new parts */
  reinserthash(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}